

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

void cpptempl::parse(ostream *stream,string *templ_text,data_map *data)

{
  pointer pcVar1;
  long *plVar2;
  ulong uVar3;
  long lVar4;
  token_vector tree;
  token_vector tokens;
  token_vector local_78;
  token_vector local_58;
  string local_40;
  
  local_58.
  super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = (templ_text->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + templ_text->_M_string_length);
  tokenize(&local_40,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_78.
  super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parse_tree(&local_58,&local_78,TOKEN_TYPE_NONE);
  if (local_78.
      super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_78.
      super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      plVar2 = *(long **)((long)&((local_78.
                                   super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr + lVar4);
      (**(code **)(*plVar2 + 8))(plVar2,stream,data);
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar3 < (ulong)((long)local_78.
                                   super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_78.
                                   super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  std::vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
  ::~vector(&local_78);
  std::vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

inline void parse(std::ostream &stream, std::string templ_text, data_map &data)
    {
        token_vector tokens ;
        tokenize(templ_text, tokens) ;
        token_vector tree ;
        parse_tree(tokens, tree) ;

        for (size_t i = 0 ; i < tree.size() ; ++i)
        {
            // Recursively calls gettext on each node in the tree.
            // gettext returns the appropriate text for that node.
            // for text, itself;
            // for variable, substitution;
            // for control statement, recursively gets kids
            tree[i]->gettext(stream, data) ;
        }
    }